

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O1

void spvtools::opt::anon_unknown_0::ReplaceLoadWithCompositeConstruct
               (IRContext *context,
               unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
               *loads_to_composites)

{
  Instruction *pIVar1;
  _Hash_node_base *p_Var2;
  undefined8 *puVar3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  undefined8 *puVar4;
  _Hash_node_base *p_Var5;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> users;
  undefined8 *local_78;
  undefined8 *puStack_70;
  long local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  p_Var5 = (loads_to_composites->_M_h)._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      pIVar1 = (Instruction *)p_Var5[1]._M_nxt;
      p_Var2 = p_Var5[2]._M_nxt;
      local_78 = (undefined8 *)0x0;
      puStack_70 = (undefined8 *)0x0;
      local_68 = 0;
      if ((context->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(context);
      }
      pcStack_40 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:119:15)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:119:15)>
                 ::_M_manager;
      local_58._M_unused._M_object = &local_78;
      local_58._8_8_ = p_Var2;
      analysis::DefUseManager::ForEachUse
                ((context->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,pIVar1,
                 (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_58);
      puVar4 = local_78;
      puVar3 = puStack_70;
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
        puVar4 = local_78;
        puVar3 = puStack_70;
      }
      for (; puVar4 != puVar3; puVar4 = puVar4 + 1) {
        pIVar1 = (Instruction *)*puVar4;
        if ((context->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(context);
        }
        analysis::DefUseManager::AnalyzeInstUse
                  ((context->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar1);
      }
      if (local_78 != (undefined8 *)0x0) {
        operator_delete(local_78,local_68 - (long)local_78);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void ReplaceLoadWithCompositeConstruct(
    IRContext* context,
    const std::unordered_map<Instruction*, Instruction*>& loads_to_composites) {
  for (const auto& load_and_composite : loads_to_composites) {
    Instruction* load = load_and_composite.first;
    Instruction* composite_construct = load_and_composite.second;

    std::vector<Instruction*> users;
    context->get_def_use_mgr()->ForEachUse(
        load, [&users, composite_construct](Instruction* user, uint32_t index) {
          user->GetOperand(index).words[0] = composite_construct->result_id();
          users.push_back(user);
        });

    for (Instruction* user : users)
      context->get_def_use_mgr()->AnalyzeInstUse(user);
  }
}